

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O3

int ply_add_list_property(p_ply ply,char *name,e_ply_type length_type,e_ply_type value_type)

{
  size_t sVar1;
  p_ply_property __dest;
  
  if (((ply == (p_ply)0x0) || (ply->fp == (FILE *)0x0)) || (ply->io_mode != PLY_WRITE)) {
    __assert_fail("ply && ply->fp && ply->io_mode == PLY_WRITE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x221,"int ply_add_list_property(p_ply, const char *, e_ply_type, e_ply_type)");
  }
  if ((name == (char *)0x0) || (sVar1 = strlen(name), 0xff < sVar1)) {
    __assert_fail("name && strlen(name) < WORDSIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x222,"int ply_add_list_property(p_ply, const char *, e_ply_type, e_ply_type)");
  }
  if (PLY_DOUBLE < length_type) {
    __assert_fail("length_type < PLY_LIST",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x227,"int ply_add_list_property(p_ply, const char *, e_ply_type, e_ply_type)");
  }
  if (PLY_DOUBLE < value_type) {
    __assert_fail("value_type < PLY_LIST",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x228,"int ply_add_list_property(p_ply, const char *, e_ply_type, e_ply_type)");
  }
  __dest = ply_grow_property(ply,ply->element + ply->nelements + -1);
  if (__dest != (p_ply_property)0x0) {
    strcpy(__dest->name,name);
    __dest->type = PLY_LIST;
    __dest->length_type = length_type;
    __dest->value_type = value_type;
  }
  return (uint)(__dest != (p_ply_property)0x0);
}

Assistant:

int ply_add_list_property(p_ply ply, const char *name,
        e_ply_type length_type, e_ply_type value_type) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(name && strlen(name) < WORDSIZE);
    if (strlen(name) >= WORDSIZE) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    assert(length_type < PLY_LIST);
    assert(value_type < PLY_LIST);
    if (length_type >= PLY_LIST || value_type >= PLY_LIST) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    element = &ply->element[ply->nelements-1];
    property = ply_grow_property(ply, element);
    if (!property) return 0;
    strcpy(property->name, name);
    property->type = PLY_LIST;
    property->length_type = length_type;
    property->value_type = value_type;
    return 1;
}